

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deferred_construction.hpp
# Opt level: O2

void __thiscall
type_safe::deferred_construction<std::__cxx11::string>::emplace<char_const(&)[4]>
          (deferred_construction<std::__cxx11::string> *this,char (*args) [4])

{
  char *local_28;
  undefined4 local_20;
  deferred_construction<std::__cxx11::string> *local_18;
  
  local_28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/foonathan[P]type_safe/include/type_safe/deferred_construction.hpp"
  ;
  local_20 = 0x6e;
  local_18 = this;
  debug_assert::detail::
  do_assert<type_safe::deferred_construction<std::__cxx11::string>::emplace<char_const(&)[4]>(char_const(&)[4])::_lambda()_1_,type_safe::detail::precondition_error_handler>
            (&local_18,&local_28,"!has_value()");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,*args,(allocator<char> *)&local_28);
  this[0x20] = (deferred_construction<std::__cxx11::string>)0x1;
  return;
}

Assistant:

void emplace(Args&&... args)
    {
        DEBUG_ASSERT(!has_value(), detail::precondition_error_handler{});
        ::new (as_void()) value_type(std::forward<Args>(args)...);
        initialized_ = true;
    }